

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O1

_Bool xdr_dplx_msg(XDR *xdrs,rpc_msg *dmsg)

{
  xdr_op xVar1;
  _Bool _Var2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_dplx_msg.c"
                  ,0x1de,"_Bool xdr_dplx_msg(XDR *, struct rpc_msg *)");
  }
  if (dmsg == (rpc_msg *)0x0) {
    __assert_fail("dmsg != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_dplx_msg.c"
                  ,0x1df,"_Bool xdr_dplx_msg(XDR *, struct rpc_msg *)");
  }
  xVar1 = xdrs->x_op;
  if (xVar1 == XDR_FREE) {
    if ((__ntirpc_pkg_params.debug_flags._3_1_ & 2) == 0) {
      return true;
    }
    (*__ntirpc_pkg_params.warnx_)("%s:%u xdrs->x_op XDR_FREE","xdr_dplx_msg",0x1f5);
    return true;
  }
  if (xVar1 == XDR_DECODE) {
    _Var2 = xdr_dplx_decode(xdrs,dmsg);
    return _Var2;
  }
  if (xVar1 == XDR_ENCODE) {
    if (dmsg->rm_direction == REPLY) {
      _Var2 = xdr_reply_encode(xdrs,dmsg);
      return _Var2;
    }
    if (dmsg->rm_direction == CALL) {
      _Var2 = xdr_call_encode(xdrs,dmsg);
      return _Var2;
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar4 = "%s:%u ERROR dmsg->rm_direction (%u)";
      uVar3 = 0x1eb;
LAB_001135df:
      (*__ntirpc_pkg_params.warnx_)(pcVar4,"xdr_dplx_msg",uVar3);
      return false;
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    pcVar4 = "%s:%u ERROR xdrs->x_op (%u)";
    uVar3 = 0x1fa;
    goto LAB_001135df;
  }
  return false;
}

Assistant:

bool
xdr_dplx_msg(XDR *xdrs, struct rpc_msg *dmsg)
{
	assert(xdrs != NULL);
	assert(dmsg != NULL);

	switch (xdrs->x_op) {
	case XDR_ENCODE:
		switch (dmsg->rm_direction) {
		case CALL:
			return (xdr_call_encode(xdrs, dmsg));
		case REPLY:
			return (xdr_reply_encode(xdrs, dmsg));
		default:
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR dmsg->rm_direction (%u)",
				__func__, __LINE__,
				dmsg->rm_direction);
			break;
		};
		break;
	case XDR_DECODE:
		return (xdr_dplx_decode(xdrs, dmsg));
	case XDR_FREE:
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u xdrs->x_op XDR_FREE",
			__func__, __LINE__);
		return (true);
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR xdrs->x_op (%u)",
			__func__, __LINE__,
			xdrs->x_op);
		break;
	};

	return (false);
}